

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64 value)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint64 uVar7;
  long lVar8;
  uint8 bytes [10];
  byte local_a [10];
  
  if (this->buffer_size_ < 10) {
    uVar5 = 0;
    if (0x7f < value) {
      uVar5 = 0;
      uVar7 = value;
      do {
        local_a[uVar5] = (byte)uVar7 | 0x80;
        uVar5 = uVar5 + 1;
        value = uVar7 >> 7;
        bVar2 = 0x3fff < uVar7;
        uVar7 = value;
      } while (bVar2);
    }
    local_a[uVar5 & 0xffffffff] = (byte)value;
    WriteRaw(this,local_a,(int)uVar5 + 1);
    return;
  }
  pbVar1 = this->buffer_;
  uVar6 = (uint)value;
  if (value >> 0x38 == 0) {
    uVar3 = (uint)(value >> 0x1c);
    if (uVar3 != 0) {
      if (0x3fff < uVar3) {
        lVar4 = 7;
        lVar8 = 8;
        if (0x1fffff < uVar3) goto LAB_0016c185;
        goto LAB_0016c195;
      }
      lVar4 = 6;
      lVar8 = 5;
      if (0x7f < uVar3) goto LAB_0016c1a4;
      goto LAB_0016c1b6;
    }
    if (0x3fff < uVar6) {
      lVar4 = 3;
      lVar8 = 4;
      if (0x1fffff < uVar6) goto LAB_0016c1bc;
      goto LAB_0016c1ca;
    }
    lVar4 = 2;
    lVar8 = 1;
    if (uVar6 < 0x80) goto LAB_0016c1e3;
  }
  else {
    lVar8 = 9;
    if ((long)value < 0) {
      pbVar1[9] = 0x81;
      lVar8 = 10;
    }
    pbVar1[8] = (byte)(value >> 0x38) | 0x80;
LAB_0016c185:
    lVar4 = lVar8;
    pbVar1[7] = (byte)(value >> 0x31) | 0x80;
LAB_0016c195:
    pbVar1[6] = (byte)(value >> 0x2a) | 0x80;
LAB_0016c1a4:
    pbVar1[5] = (byte)(value >> 0x23) | 0x80;
    lVar8 = lVar4;
LAB_0016c1b6:
    pbVar1[4] = (byte)(value >> 0x1c) | 0x80;
LAB_0016c1bc:
    lVar4 = lVar8;
    pbVar1[3] = (byte)(value >> 0x15) | 0x80;
LAB_0016c1ca:
    pbVar1[2] = (byte)(value >> 0xe) | 0x80;
  }
  pbVar1[1] = (byte)(value >> 7) | 0x80;
  lVar8 = lVar4;
LAB_0016c1e3:
  *pbVar1 = (byte)value | 0x80;
  pbVar1[lVar8 + -1] = pbVar1[lVar8 + -1] & 0x7f;
  this->buffer_ = this->buffer_ + lVar8;
  this->buffer_size_ = this->buffer_size_ - (int)lVar8;
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64(uint64 value) {
  if (buffer_size_ >= kMaxVarintBytes) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;

    uint8* end = WriteVarint64ToArrayInline(value, target);
    int size = end - target;
    Advance(size);
  } else {
    // Slow path:  This write might cross the end of the buffer, so we
    // compose the bytes first then use WriteRaw().
    uint8 bytes[kMaxVarintBytes];
    int size = 0;
    while (value > 0x7F) {
      bytes[size++] = (static_cast<uint8>(value) & 0x7F) | 0x80;
      value >>= 7;
    }
    bytes[size++] = static_cast<uint8>(value) & 0x7F;
    WriteRaw(bytes, size);
  }
}